

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Status leveldb::Table::Open(Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  bool bVar1;
  Block *this;
  Rep *rep_00;
  BlockHandle *pBVar2;
  uint64_t uVar3;
  Table *this_00;
  ulong in_RCX;
  RandomAccessFile *in_RDX;
  void *in_RSI;
  Status *in_RDI;
  undefined8 *in_R8;
  Rep *rep;
  Block *index_block;
  ReadOptions opt;
  BlockContents index_block_contents;
  Footer footer;
  RandomAccessFile *in_stack_000000b8;
  Slice footer_input;
  char footer_space [48];
  Status *s;
  Status *in_stack_fffffffffffffeb8;
  Rep *in_stack_fffffffffffffec0;
  BlockContents *in_stack_fffffffffffffec8;
  ReadOptions local_e8;
  Slice *in_stack_ffffffffffffff40;
  Footer *in_stack_ffffffffffffff48;
  Footer local_b0;
  undefined1 local_89;
  Slice local_88;
  undefined1 local_78 [48];
  Footer *in_stack_ffffffffffffffb8;
  Table *in_stack_ffffffffffffffc0;
  
  *in_R8 = 0;
  if (in_RCX < 0x30) {
    Slice::Slice((Slice *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    Slice::Slice((Slice *)&stack0xffffffffffffffb8);
    Status::Corruption(&in_stack_fffffffffffffec8->data,(Slice *)in_stack_fffffffffffffec0);
  }
  else {
    Slice::Slice(&local_88);
    local_89 = 0;
    (*in_RDX->_vptr_RandomAccessFile[2])(in_RDI,in_RDX,in_RCX - 0x30,0x30,&local_88,local_78);
    bVar1 = Status::ok(in_RDI);
    if (bVar1) {
      Footer::Footer((Footer *)in_stack_fffffffffffffec0);
      Footer::DecodeFrom(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      Status::operator=((Status *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      Status::~Status((Status *)in_stack_fffffffffffffec0);
      bVar1 = Status::ok(in_RDI);
      if (bVar1) {
        BlockContents::BlockContents((BlockContents *)0x10d1ee);
        bVar1 = Status::ok(in_RDI);
        if (bVar1) {
          ReadOptions::ReadOptions(&local_e8);
          if ((*(byte *)((long)in_RSI + 10) & 1) != 0) {
            local_e8.verify_checksums = true;
          }
          Footer::index_handle(&local_b0);
          ReadBlock(in_stack_000000b8,(Options *)footer.index_handle_.size_,
                    (ReadOptions *)footer.index_handle_.offset_,
                    (BlockHandle *)footer.metaindex_handle_.size_,
                    (BlockContents *)footer.metaindex_handle_.offset_);
          Status::operator=((Status *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          Status::~Status((Status *)in_stack_fffffffffffffec0);
        }
        bVar1 = Status::ok(in_RDI);
        if (bVar1) {
          this = (Block *)operator_new(0x18);
          Block::Block(this,in_stack_fffffffffffffec8);
          rep_00 = (Rep *)operator_new(0x8a0);
          Rep::Rep(in_stack_fffffffffffffec0);
          memcpy(rep_00,in_RSI,0x860);
          rep_00->file = in_RDX;
          pBVar2 = Footer::metaindex_handle(&local_b0);
          (rep_00->metaindex_handle).offset_ = pBVar2->offset_;
          (rep_00->metaindex_handle).size_ = pBVar2->size_;
          rep_00->index_block = this;
          if (*(long *)((long)in_RSI + 0x30) == 0) {
            uVar3 = 0;
          }
          else {
            uVar3 = (**(code **)(**(long **)((long)in_RSI + 0x30) + 0x38))();
          }
          rep_00->cache_id = uVar3;
          rep_00->filter_data = (char *)0x0;
          rep_00->filter = (FilterBlockReader *)0x0;
          this_00 = (Table *)operator_new(8);
          Table(this_00,rep_00);
          *in_R8 = this_00;
          ReadMeta(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
      }
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, options, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}